

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O1

bool TestAllRecoveryData(WirehairCodec encoder,WirehairCodec decoder,uint N,uint blockBytes,
                        uint finalBytes,uint8_t *message,uint8_t *decodedMessage,uint messageBytes)

{
  bool bVar1;
  WirehairResult WVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint32_t writeLen;
  uint32_t Nm1Len;
  uint32_t local_54;
  WirehairCodec local_50;
  uint local_48;
  uint32_t local_44;
  ulong local_40;
  uint8_t *local_38;
  
  uVar6 = (ulong)N;
  local_44 = 0;
  local_50 = decoder;
  local_38 = message;
  WVar2 = wirehair_encode(encoder,N - 1,decodedMessage,blockBytes,&local_44);
  local_48 = finalBytes;
  local_40 = uVar6;
  if (WVar2 == Wirehair_Success) {
    if (local_44 == finalBytes) {
      WVar2 = wirehair_decode(local_50,N - 1,decodedMessage,local_44);
      uVar8 = 1;
      bVar1 = WVar2 == Wirehair_NeedMore;
      if (bVar1) goto LAB_001038c6;
      pcVar7 = "wirehair_decode failed for N-1 and N = ";
      goto LAB_00103831;
    }
    pcVar7 = "wirehair_encode failed wrong len for N-1 and N = ";
    lVar5 = 0x31;
  }
  else {
    pcVar7 = "wirehair_encode failed for N-1 and N = ";
LAB_00103831:
    lVar5 = 0x27;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  bVar1 = false;
  uVar8 = 0;
LAB_001038c6:
  if (!bVar1) {
    return false;
  }
  uVar6 = local_40 & 0xffffffff;
  do {
    uVar8 = uVar8 + 1;
    local_54 = 0;
    uVar9 = (uint)uVar6;
    WVar2 = wirehair_encode(encoder,uVar9,decodedMessage,blockBytes,&local_54);
    if (WVar2 == Wirehair_Success) {
      if (local_54 != blockBytes) {
        lVar5 = 0x31;
        poVar4 = (ostream *)&std::cout;
        pcVar7 = "wirehair_encode failed wrong len for N-1 and N = ";
        goto LAB_0010399a;
      }
      WVar2 = wirehair_decode(local_50,uVar9,decodedMessage,local_54);
      if (WVar2 == Wirehair_Success) {
        iVar3 = 8;
      }
      else {
        if (WVar2 != Wirehair_NeedMore) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"wirehair_decode failed for ",0x1b);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          lVar5 = 9;
          pcVar7 = " and N = ";
          goto LAB_0010399a;
        }
        iVar3 = 0;
      }
    }
    else {
      lVar5 = 0x1f;
      poVar4 = (ostream *)&std::cout;
      pcVar7 = "wirehair_encode failed for N = ";
LAB_0010399a:
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar5);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar3 = 1;
    }
    if (iVar3 != 0) {
      if (iVar3 != 8) {
        return false;
      }
      uVar9 = (uint)local_40;
      if (uVar9 + 4 <= uVar8) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"TestAllRecoveryData: Too much overhead: ",0x28);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," extra for N=",0xd);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," Seed=n/a BlockBytes=",0x15);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      bVar1 = DoesCodecProduceOriginals
                        (local_50,uVar9,blockBytes,local_48,local_38,decodedMessage,messageBytes);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"!! Decoder2 failed to produce originals",0x27);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        return false;
      }
      return true;
    }
    uVar6 = (ulong)(uVar9 + 1);
  } while( true );
}

Assistant:

static bool TestAllRecoveryData(
    WirehairCodec encoder,
    WirehairCodec decoder,
    unsigned N,
    unsigned blockBytes,
    unsigned finalBytes,
    const uint8_t* message,
    uint8_t* decodedMessage,
    unsigned messageBytes)
{
    unsigned needed = 0;

#ifdef ENABLE_ALL_RECOVERY_FINAL_BLOCK
    // Check the special case final block:
    {
        uint32_t Nm1Len = 0;
        WirehairResult encodeResult = wirehair_encode(encoder, N - 1, decodedMessage, blockBytes, &Nm1Len);

        if (encodeResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed for N-1 and N = " << N << endl;
            return false;
        }

        if (Nm1Len != finalBytes)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed wrong len for N-1 and N = " << N << endl;
            return false;
        }

        WirehairResult decodeResult = wirehair_decode(decoder, N - 1, decodedMessage, Nm1Len);

        if (decodeResult != Wirehair_NeedMore)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_decode failed for N-1 and N = " << N << endl;
            return false;
        }

        ++needed;
    }
#endif

    for (unsigned blockId = N;; ++blockId)
    {
        ++needed;

        uint32_t writeLen = 0;
        WirehairResult encodeResult = wirehair_encode(encoder, blockId, decodedMessage, blockBytes, &writeLen);

        if (encodeResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed for N = " << N << endl;
            return false;
        }

        if (writeLen != blockBytes)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_encode failed wrong len for N-1 and N = " << N << endl;
            return false;
        }

        WirehairResult decodeResult = wirehair_decode(decoder, blockId, decodedMessage, writeLen);

        if (decodeResult != Wirehair_NeedMore)
        {
            if (decodeResult == Wirehair_Success) {
                break;
            }

            SIAMESE_DEBUG_BREAK();
            cout << "wirehair_decode failed for " << blockId << " and N = " << N << endl;
            return false;
        }
    }

    if (needed >= N + kExtraWarnThreshold) {
        //SIAMESE_DEBUG_BREAK();
        cout << "TestAllRecoveryData: Too much overhead: " << (needed - N) << " extra for N=" << N << " Seed=n/a BlockBytes=" << blockBytes << endl;
        //return false;
    }

    if (!DoesCodecProduceOriginals(decoder, N, blockBytes, finalBytes, message, decodedMessage, messageBytes))
    {
        SIAMESE_DEBUG_BREAK();
        cout << "!! Decoder2 failed to produce originals" << endl;
        return false;
    }

    return true;
}